

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O0

void __thiscall Assimp::D3MF::D3MFExporter::writeBaseMaterials(D3MFExporter *this)

{
  aiReturn aVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  undefined1 local_4e8 [8];
  aiColor4D color;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  undefined1 local_484 [8];
  aiString name;
  aiMaterial *mat;
  size_t i;
  string tmp;
  string hexDiffuseColor;
  string strName;
  D3MFExporter *this_local;
  
  std::operator<<((ostream *)&this->mModelOutput,"<basematerials id=\"1\">\n");
  std::__cxx11::string::string((string *)(hexDiffuseColor.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(tmp.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&i);
  for (mat = (aiMaterial *)0x0; mat < (aiMaterial *)(ulong)this->mScene->mNumMaterials;
      mat = (aiMaterial *)((long)&mat->mProperties + 1)) {
    name.data._1016_8_ = this->mScene->mMaterials[(long)mat];
    aiString::aiString((aiString *)local_484);
    aVar1 = aiMaterial::Get((aiMaterial *)name.data._1016_8_,"?mat.name",0,0,(aiString *)local_484);
    if (aVar1 == aiReturn_SUCCESS) {
      pcVar2 = aiString::C_Str((aiString *)local_484);
      std::__cxx11::string::operator=((string *)(hexDiffuseColor.field_2._M_local_buf + 8),pcVar2);
    }
    else {
      to_string<unsigned_long>((string *)&color.b,(unsigned_long)mat);
      std::operator+(&local_4b8,"basemat_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&color.b);
      std::__cxx11::string::operator=
                ((string *)(hexDiffuseColor.field_2._M_local_buf + 8),(string *)&local_4b8);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::~string((string *)&color.b);
    }
    aiColor4t<float>::aiColor4t((aiColor4t<float> *)local_4e8);
    aVar1 = aiMaterial::Get((aiMaterial *)name.data._1016_8_,"$clr.diffuse",0,0,
                            (aiColor4t<float> *)local_4e8);
    if (aVar1 == aiReturn_SUCCESS) {
      std::__cxx11::string::clear();
      std::__cxx11::string::clear();
      std::__cxx11::string::operator=((string *)(tmp.field_2._M_local_buf + 8),"#");
      DecimalToHexa<float>(&local_508,(float)local_4e8._0_4_);
      std::__cxx11::string::operator=((string *)&i,(string *)&local_508);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::operator+=((string *)(tmp.field_2._M_local_buf + 8),(string *)&i);
      DecimalToHexa<float>(&local_528,(float)local_4e8._4_4_);
      std::__cxx11::string::operator=((string *)&i,(string *)&local_528);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::operator+=((string *)(tmp.field_2._M_local_buf + 8),(string *)&i);
      DecimalToHexa<float>(&local_548,color.r);
      std::__cxx11::string::operator=((string *)&i,(string *)&local_548);
      std::__cxx11::string::~string((string *)&local_548);
      std::__cxx11::string::operator+=((string *)(tmp.field_2._M_local_buf + 8),(string *)&i);
      DecimalToHexa<float>(&local_568,color.g);
      std::__cxx11::string::operator=((string *)&i,(string *)&local_568);
      std::__cxx11::string::~string((string *)&local_568);
      std::__cxx11::string::operator+=((string *)(tmp.field_2._M_local_buf + 8),(string *)&i);
    }
    else {
      std::__cxx11::string::operator=((string *)(tmp.field_2._M_local_buf + 8),"#FFFFFFFF");
    }
    std::operator+(&local_608,"<base name=\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&hexDiffuseColor.field_2 + 8));
    std::operator+(&local_5e8,&local_608,"\" ");
    std::operator+(&local_5c8,&local_5e8," displaycolor=\"");
    std::operator+(&local_5a8,&local_5c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&tmp.field_2 + 8));
    std::operator+(&local_588,&local_5a8,"\" />\n");
    std::operator<<((ostream *)&this->mModelOutput,(string *)&local_588);
    std::__cxx11::string::~string((string *)&local_588);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_5e8);
    std::__cxx11::string::~string((string *)&local_608);
  }
  std::operator<<((ostream *)&this->mModelOutput,"</basematerials>\n");
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string((string *)(tmp.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(hexDiffuseColor.field_2._M_local_buf + 8));
  return;
}

Assistant:

void D3MFExporter::writeBaseMaterials() {
    mModelOutput << "<basematerials id=\"1\">\n";
    std::string strName, hexDiffuseColor , tmp;
    for ( size_t i = 0; i < mScene->mNumMaterials; ++i ) {
        aiMaterial *mat = mScene->mMaterials[ i ];
        aiString name;
        if ( mat->Get( AI_MATKEY_NAME, name ) != aiReturn_SUCCESS ) {
            strName = "basemat_" + to_string( i );
        } else {
            strName = name.C_Str();
        }
        aiColor4D color;
        if ( mat->Get( AI_MATKEY_COLOR_DIFFUSE, color ) == aiReturn_SUCCESS ) {
            hexDiffuseColor.clear();
            tmp.clear();
            hexDiffuseColor = "#";
            
            tmp = DecimalToHexa( color.r );
            hexDiffuseColor += tmp;
            tmp = DecimalToHexa( color.g );
            hexDiffuseColor += tmp;
            tmp = DecimalToHexa( color.b );
            hexDiffuseColor += tmp;
            tmp = DecimalToHexa( color.a );
            hexDiffuseColor += tmp;
        } else {
            hexDiffuseColor = "#FFFFFFFF";
        }

        mModelOutput << "<base name=\""+strName+"\" "+" displaycolor=\""+hexDiffuseColor+"\" />\n";
    }
    mModelOutput << "</basematerials>\n";
}